

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::read_dht_marker(jpeg_decoder *this)

{
  uint uVar1;
  uint uVar2;
  uint8 *puVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  uint8 huff_num [17];
  bool symbol_present [256];
  uint8 huff_val [256];
  undefined1 local_258;
  undefined7 uStack_257;
  undefined8 uStack_250;
  uint8 local_248;
  char local_238 [256];
  undefined1 local_138 [264];
  
  uVar1 = get_bits(this,0x10);
  if (uVar1 < 2) {
LAB_0014f166:
    stop_decoding(this,JPGD_BAD_DHT_MARKER);
  }
  uVar4 = uVar1 - 2;
  do {
    if (uVar4 == 0) {
      return;
    }
    uVar1 = get_bits(this,8);
    local_258 = 0;
    lVar6 = 1;
    uVar5 = 0;
    do {
      uVar2 = get_bits(this,8);
      (&local_258)[lVar6] = (char)uVar2;
      uVar5 = uVar5 + (uVar2 & 0xff);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x11);
    if (0xff < uVar5) {
LAB_0014f159:
      stop_decoding(this,JPGD_BAD_DHT_COUNTS);
    }
    memset(local_238,0,0x100);
    if (uVar5 != 0) {
      uVar7 = 0;
      do {
        uVar2 = get_bits(this,8);
        if (local_238[(int)uVar2] == '\x01') goto LAB_0014f159;
        local_138[uVar7] = (char)uVar2;
        local_238[(int)uVar2] = '\x01';
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
    }
    bVar8 = uVar4 < uVar5 + 0x11;
    uVar4 = uVar4 - (uVar5 + 0x11);
    if (bVar8) goto LAB_0014f166;
    lVar6 = (ulong)(uVar1 & 0xf) + (ulong)(uVar1 >> 2 & 4);
    if (7 < (uint)lVar6) {
      stop_decoding(this,JPGD_BAD_DHT_INDEX);
    }
    puVar3 = this->m_huff_num[lVar6];
    if (puVar3 == (uint8 *)0x0) {
      puVar3 = (uint8 *)alloc(this,0x11,false);
      this->m_huff_num[lVar6] = puVar3;
    }
    if (this->m_huff_val[lVar6] == (uint8 *)0x0) {
      puVar3 = (uint8 *)alloc(this,0x100,false);
      this->m_huff_val[lVar6] = puVar3;
      puVar3 = this->m_huff_num[lVar6];
    }
    this->m_huff_ac[lVar6] = '\0';
    puVar3[0x10] = local_248;
    *(ulong *)puVar3 = CONCAT71(uStack_257,local_258);
    *(undefined8 *)(puVar3 + 8) = uStack_250;
    memcpy(this->m_huff_val[lVar6],local_138,0x100);
  } while( true );
}

Assistant:

void jpeg_decoder::read_dht_marker()
	{
		int i, index, count;
		uint8 huff_num[17];
		uint8 huff_val[256];

		uint num_left = get_bits(16);

		if (num_left < 2)
			stop_decoding(JPGD_BAD_DHT_MARKER);

		num_left -= 2;

		while (num_left)
		{
			index = get_bits(8);

			huff_num[0] = 0;

			count = 0;

			for (i = 1; i <= 16; i++)
			{
				huff_num[i] = static_cast<uint8>(get_bits(8));
				count += huff_num[i];
			}

			if (count > 255)
				stop_decoding(JPGD_BAD_DHT_COUNTS);

			bool symbol_present[256];
			memset(symbol_present, 0, sizeof(symbol_present));

			for (i = 0; i < count; i++)
			{
				const int s = get_bits(8);

				// Check for obviously bogus tables.
				if (symbol_present[s])
					stop_decoding(JPGD_BAD_DHT_COUNTS);

				huff_val[i] = static_cast<uint8_t>(s);
				symbol_present[s] = true;
			}

			i = 1 + 16 + count;

			if (num_left < (uint)i)
				stop_decoding(JPGD_BAD_DHT_MARKER);

			num_left -= i;

			if ((index & 0x10) > 0x10)
				stop_decoding(JPGD_BAD_DHT_INDEX);

			index = (index & 0x0F) + ((index & 0x10) >> 4) * (JPGD_MAX_HUFF_TABLES >> 1);

			if (index >= JPGD_MAX_HUFF_TABLES)
				stop_decoding(JPGD_BAD_DHT_INDEX);

			if (!m_huff_num[index])
				m_huff_num[index] = (uint8*)alloc(17);

			if (!m_huff_val[index])
				m_huff_val[index] = (uint8*)alloc(256);

			m_huff_ac[index] = (index & 0x10) != 0;
			memcpy(m_huff_num[index], huff_num, 17);
			memcpy(m_huff_val[index], huff_val, 256);
		}
	}